

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day18.cpp
# Opt level: O0

void day18(input_t input)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  reference puVar4;
  size_type sVar5;
  pair<std::_Rb_tree_const_iterator<unsigned_short>,_bool> pVar6;
  uint32_t loop;
  uint32_t base;
  pair<std::_Rb_tree_const_iterator<unsigned_short>,_bool> result;
  Map *in_stack_000002b0;
  uint32_t idx;
  set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_> seen;
  value_type *in_stack_fffffffffffff220;
  vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
  *in_stack_fffffffffffff228;
  char **in_stack_fffffffffffff230;
  undefined4 in_stack_fffffffffffff238;
  undefined4 in_stack_fffffffffffff23c;
  undefined4 in_stack_fffffffffffff240;
  undefined4 in_stack_fffffffffffff244;
  set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>
  *in_stack_fffffffffffff248;
  Map *this;
  undefined7 in_stack_fffffffffffff250;
  undefined1 in_stack_fffffffffffff257;
  vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>
  *in_stack_fffffffffffff258;
  
  std::set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>::set
            ((set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_> *
             )0x13b51c);
  std::vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>::reserve
            (in_stack_fffffffffffff258,CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250)
            );
  std::vector<(anonymous_namespace)::Map,std::allocator<(anonymous_namespace)::Map>>::
  emplace_back<char*&>
            ((vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_> *)
             CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238),in_stack_fffffffffffff230
            );
  std::set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>::insert
            (in_stack_fffffffffffff248,
             (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
  do {
    std::vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>::back
              (in_stack_fffffffffffff228);
    anon_unknown.dwarf_78111::Map::advance(in_stack_000002b0);
    std::vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>::push_back
              (in_stack_fffffffffffff228,in_stack_fffffffffffff220);
    this = (Map *)&stack0xffffffffffffff90;
    std::set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>::size
              ((set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>
                *)0x13b5d8);
    pVar6 = std::
            set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>::
            insert((set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>
                    *)this,(value_type_conflict3 *)
                           CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
  } while (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
  puVar4 = std::_Rb_tree_const_iterator<unsigned_short>::operator*
                     ((_Rb_tree_const_iterator<unsigned_short> *)0x13b62c);
  uVar1 = (uint)*puVar4;
  sVar5 = std::set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>
          ::size((set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>
                  *)0x13b640);
  std::vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>::operator[]
            ((vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_> *)
             (anonymous_namespace)::History::V,10);
  uVar2 = anon_unknown.dwarf_78111::Map::value(this);
  std::vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_>::operator[]
            ((vector<(anonymous_namespace)::Map,_std::allocator<(anonymous_namespace)::Map>_> *)
             (anonymous_namespace)::History::V,
             (ulong)(uVar1 + (1000000000 - uVar1) % ((int)sVar5 - uVar1)));
  uVar3 = anon_unknown.dwarf_78111::Map::value(this);
  printf("Day 18 Part 1: %u\nDay 18 Part 2: %u\n",(ulong)uVar2,(ulong)uVar3);
  std::set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_>::~set
            ((set<unsigned_short,_(anonymous_namespace)::History,_std::allocator<unsigned_short>_> *
             )0x13b700);
  return;
}

Assistant:

void day18(input_t input) {
	std::set<uint16_t, History> seen;
	History::V.reserve(1000);
	History::V.emplace_back(input.s);
	seen.insert(0);

	uint32_t idx = 0;
	for (;;) {
		History::V.push_back(History::V.back().advance());
		auto result = seen.insert(seen.size());
		if (!result.second) {
			uint32_t base = *result.first, loop = seen.size() - base;
			idx = base + (1000000000 - base) % loop;
			break;
		}
	}

	printf("Day 18 Part 1: %u\nDay 18 Part 2: %u\n", History::V[10].value(), History::V[idx].value());
}